

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsBoolToBoolean(bool value,JsValueRef *booleanValue)

{
  ScriptContext *pSVar1;
  JavascriptBoolean *pJVar2;
  JsrtContext *pJVar3;
  JsErrorCode JVar4;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_38 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_38 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar3 = JsrtContext::GetCurrent();
  if (pJVar3 == (JsrtContext *)0x0) {
    JVar4 = JsErrorNoCurrentContext;
  }
  else {
    pSVar1 = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (pSVar1->TTDShouldPerformRecordAction == true) {
      TTD::EventLog::RecordJsRTCreateBoolean
                (pSVar1->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_38,value);
    }
    if (booleanValue == (JsValueRef *)0x0) {
      JVar4 = JsErrorNullArgument;
    }
    else {
      pJVar2 = (&(((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
                 ).booleanTrue)[!value].ptr;
      *booleanValue = pJVar2;
      JVar4 = JsNoError;
      if (pSVar1->TTDShouldPerformRecordAction == true) {
        if (_actionEntryPopper.m_actionEvent == (EventLogEntry *)0x0) {
          TTDAbort_unrecoverable_error("Why are we calling this then???");
        }
        *(JavascriptBoolean **)_actionEntryPopper.m_actionEvent = pJVar2;
        JVar4 = JsNoError;
      }
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
    if (auStack_38 != (undefined1  [8])0x0) {
      if (*(int32 *)((long)auStack_38 + 4) != -1) {
        TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
      }
      *(JsErrorCode *)((long)auStack_38 + 4) = JVar4;
    }
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsBoolToBoolean(_In_ bool value, _Out_ JsValueRef *booleanValue)
{
    return ContextAPINoScriptWrapper([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTCreateBoolean, value);

        PARAM_NOT_NULL(booleanValue);

        *booleanValue = value ? scriptContext->GetLibrary()->GetTrue() : scriptContext->GetLibrary()->GetFalse();

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, booleanValue);

        return JsNoError;
    },
    /*allowInObjectBeforeCollectCallback*/true);
}